

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_internal.h
# Opt level: O1

ParseDescriptorResponseStruct * __thiscall
cfd::js::api::
ExecuteStructApi<cfd::js::api::ParseDescriptorRequestStruct,cfd::js::api::ParseDescriptorResponseStruct>
          (ParseDescriptorResponseStruct *__return_storage_ptr__,api *this,
          ParseDescriptorRequestStruct *request,
          function<cfd::js::api::ParseDescriptorResponseStruct_(const_cfd::js::api::ParseDescriptorRequestStruct_&)>
          *call_function,string *fuction_name)

{
  CfdException *cfde;
  long *plVar1;
  undefined1 auVar2 [12];
  undefined1 local_208 [16];
  _Alloc_hider local_1f8;
  anon_enum_32 local_1cc;
  undefined1 local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string asStack_148 [32];
  bool local_128;
  string asStack_120 [32];
  pointer local_100;
  pointer local_f8;
  pointer local_f0;
  pointer local_e8;
  pointer local_e0;
  pointer local_d8;
  int local_d0;
  string asStack_c8 [32];
  string asStack_a8 [40];
  _Rb_tree_node_base local_80;
  size_t local_60;
  _Rb_tree_node_base local_50;
  size_t local_30;
  
  ParseDescriptorResponseStruct::ParseDescriptorResponseStruct(__return_storage_ptr__);
  cfd::Initialize();
  if ((request->descriptor)._M_string_length == 0) {
    auVar2 = std::__throw_bad_function_call();
    if (auVar2._8_4_ == 3) {
      cfde = (CfdException *)__cxa_begin_catch(auVar2._0_8_);
      local_1c8._0_8_ = "cfdjs_internal.h";
      local_1c8._8_4_ = 0x32;
      local_1c8._16_8_ = "ExecuteStructApi";
      local_1cc = (**(code **)(*(long *)cfde + 0x18))(cfde);
      local_208._0_8_ = (**(code **)(*(long *)cfde + 0x10))(cfde);
      core::logger::log<std::__cxx11::string&,cfd::core::CfdError&,char_const*&>
                ((CfdSourceLocation *)local_1c8,kCfdLogLevelWarning,
                 "Failed to {}. CfdException occurred:  code={}, message={}",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)call_function,
                 &local_1cc,(char **)local_208);
      ConvertCfdExceptionToStruct((InnerErrorResponseStruct *)local_1c8,cfde);
      InnerErrorResponseStruct::operator=
                (&__return_storage_ptr__->error,(InnerErrorResponseStruct *)local_1c8);
      InnerErrorResponseStruct::~InnerErrorResponseStruct((InnerErrorResponseStruct *)local_1c8);
      __cxa_end_catch();
    }
    else {
      plVar1 = (long *)__cxa_begin_catch(auVar2._0_8_);
      if (auVar2._8_4_ == 2) {
        local_1c8._0_8_ = "cfdjs_internal.h";
        local_1c8._8_4_ = 0x38;
        local_1c8._16_8_ = "ExecuteStructApi";
        local_208._0_8_ = (**(code **)(*plVar1 + 0x10))(plVar1);
        core::logger::log<std::__cxx11::string&,char_const*&>
                  ((CfdSourceLocation *)local_1c8,kCfdLogLevelWarning,
                   "Failed to {}. Exception occurred: message={}",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   call_function,(char **)local_208);
        core::CfdException::CfdException((CfdException *)local_208);
        ConvertCfdExceptionToStruct((InnerErrorResponseStruct *)local_1c8,(CfdException *)local_208)
        ;
        InnerErrorResponseStruct::operator=
                  (&__return_storage_ptr__->error,(InnerErrorResponseStruct *)local_1c8);
        InnerErrorResponseStruct::~InnerErrorResponseStruct((InnerErrorResponseStruct *)local_1c8);
        core::CfdException::~CfdException((CfdException *)local_208);
        __cxa_end_catch();
      }
      else {
        local_1c8._0_8_ = "cfdjs_internal.h";
        local_1c8._8_4_ = 0x3d;
        local_1c8._16_8_ = "ExecuteStructApi";
        core::logger::log<std::__cxx11::string&>
                  ((CfdSourceLocation *)local_1c8,kCfdLogLevelWarning,
                   "Failed to {}. Unknown exception occurred.",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   call_function);
        core::CfdException::CfdException((CfdException *)local_208);
        ConvertCfdExceptionToStruct((InnerErrorResponseStruct *)local_1c8,(CfdException *)local_208)
        ;
        InnerErrorResponseStruct::operator=
                  (&__return_storage_ptr__->error,(InnerErrorResponseStruct *)local_1c8);
        InnerErrorResponseStruct::~InnerErrorResponseStruct((InnerErrorResponseStruct *)local_1c8);
        core::CfdException::~CfdException((CfdException *)local_208);
        __cxa_end_catch();
      }
    }
  }
  else {
    (*(code *)(request->descriptor).field_2._M_allocated_capacity)((string *)local_1c8,request,this)
    ;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1c8);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->address,local_1a8);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->locking_script,local_188);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->hash_type,local_168);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->redeem_script,asStack_148);
    __return_storage_ptr__->include_multisig = local_128;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->tree_string,asStack_120);
    local_208._0_8_ =
         (__return_storage_ptr__->keys).
         super__Vector_base<cfd::js::api::DescriptorKeyJsonStruct,_std::allocator<cfd::js::api::DescriptorKeyJsonStruct>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_208._8_8_ =
         (__return_storage_ptr__->keys).
         super__Vector_base<cfd::js::api::DescriptorKeyJsonStruct,_std::allocator<cfd::js::api::DescriptorKeyJsonStruct>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1f8._M_p =
         (pointer)(__return_storage_ptr__->keys).
                  super__Vector_base<cfd::js::api::DescriptorKeyJsonStruct,_std::allocator<cfd::js::api::DescriptorKeyJsonStruct>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->keys).
    super__Vector_base<cfd::js::api::DescriptorKeyJsonStruct,_std::allocator<cfd::js::api::DescriptorKeyJsonStruct>_>
    ._M_impl.super__Vector_impl_data._M_start = local_100;
    (__return_storage_ptr__->keys).
    super__Vector_base<cfd::js::api::DescriptorKeyJsonStruct,_std::allocator<cfd::js::api::DescriptorKeyJsonStruct>_>
    ._M_impl.super__Vector_impl_data._M_finish = local_f8;
    (__return_storage_ptr__->keys).
    super__Vector_base<cfd::js::api::DescriptorKeyJsonStruct,_std::allocator<cfd::js::api::DescriptorKeyJsonStruct>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_f0;
    local_100 = (pointer)0x0;
    local_f8 = (pointer)0x0;
    local_f0 = (pointer)0x0;
    std::
    vector<cfd::js::api::DescriptorKeyJsonStruct,_std::allocator<cfd::js::api::DescriptorKeyJsonStruct>_>
    ::~vector((vector<cfd::js::api::DescriptorKeyJsonStruct,_std::allocator<cfd::js::api::DescriptorKeyJsonStruct>_>
               *)local_208);
    local_208._0_8_ =
         (__return_storage_ptr__->scripts).
         super__Vector_base<cfd::js::api::DescriptorScriptJsonStruct,_std::allocator<cfd::js::api::DescriptorScriptJsonStruct>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_208._8_8_ =
         (__return_storage_ptr__->scripts).
         super__Vector_base<cfd::js::api::DescriptorScriptJsonStruct,_std::allocator<cfd::js::api::DescriptorScriptJsonStruct>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1f8._M_p =
         (pointer)(__return_storage_ptr__->scripts).
                  super__Vector_base<cfd::js::api::DescriptorScriptJsonStruct,_std::allocator<cfd::js::api::DescriptorScriptJsonStruct>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->scripts).
    super__Vector_base<cfd::js::api::DescriptorScriptJsonStruct,_std::allocator<cfd::js::api::DescriptorScriptJsonStruct>_>
    ._M_impl.super__Vector_impl_data._M_start = local_e8;
    (__return_storage_ptr__->scripts).
    super__Vector_base<cfd::js::api::DescriptorScriptJsonStruct,_std::allocator<cfd::js::api::DescriptorScriptJsonStruct>_>
    ._M_impl.super__Vector_impl_data._M_finish = local_e0;
    (__return_storage_ptr__->scripts).
    super__Vector_base<cfd::js::api::DescriptorScriptJsonStruct,_std::allocator<cfd::js::api::DescriptorScriptJsonStruct>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_d8;
    local_e8 = (pointer)0x0;
    local_e0 = (pointer)0x0;
    local_d8 = (pointer)0x0;
    std::
    vector<cfd::js::api::DescriptorScriptJsonStruct,_std::allocator<cfd::js::api::DescriptorScriptJsonStruct>_>
    ::~vector((vector<cfd::js::api::DescriptorScriptJsonStruct,_std::allocator<cfd::js::api::DescriptorScriptJsonStruct>_>
               *)local_208);
    (__return_storage_ptr__->error).code = local_d0;
    std::__cxx11::string::operator=((string *)&(__return_storage_ptr__->error).type,asStack_c8);
    std::__cxx11::string::operator=((string *)&(__return_storage_ptr__->error).message,asStack_a8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(__return_storage_ptr__->error).ignore_items._M_t);
    if (local_80._M_parent != (_Base_ptr)0x0) {
      (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_color = local_80._M_color;
      (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = local_80._M_parent;
      (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = local_80._M_left;
      (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = local_80._M_right;
      (local_80._M_parent)->_M_parent =
           &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header.
            _M_header;
      (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count
           = local_60;
      local_80._M_parent = (_Base_ptr)0x0;
      local_60 = 0;
      local_80._M_left = &local_80;
      local_80._M_right = &local_80;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(__return_storage_ptr__->ignore_items)._M_t);
    if (local_50._M_parent != (_Base_ptr)0x0) {
      (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           local_50._M_color;
      (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
           = local_50._M_parent;
      (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           local_50._M_left;
      (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_50._M_right;
      (local_50._M_parent)->_M_parent =
           &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header;
      (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_30;
      local_50._M_parent = (_Base_ptr)0x0;
      local_30 = 0;
      local_50._M_left = &local_50;
      local_50._M_right = &local_50;
    }
    ParseDescriptorResponseStruct::~ParseDescriptorResponseStruct
              ((ParseDescriptorResponseStruct *)local_1c8);
  }
  return __return_storage_ptr__;
}

Assistant:

ResponseStructType ExecuteStructApi(
    const RequestStructType& request,
    std::function<ResponseStructType(const RequestStructType&)> call_function,
    std::string fuction_name) {
  ResponseStructType response;
  try {
    cfd::Initialize();

    response = call_function(request);
  } catch (const CfdException& cfde) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to {}. CfdException occurred:  code={}, message={}",
        fuction_name, cfde.GetErrorCode(), cfde.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(cfde);
  } catch (const std::exception& except) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Exception occurred: message={}",
        fuction_name, except.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  } catch (...) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Unknown exception occurred.",
        fuction_name);
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  }
  return response;
}